

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.h
# Opt level: O1

bool __thiscall Image::writeBmp(Image *this,char *fileName)

{
  FILE *__s;
  int iVar1;
  BmpHeader bmp;
  undefined4 local_48;
  int iStack_44;
  undefined8 uStack_40;
  undefined4 local_38;
  int iStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  long local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  uStack_20 = 0;
  local_18 = 0;
  _local_38 = CONCAT44(this->_width,0x28);
  iVar1 = this->_width * this->_height;
  _iStack_30 = CONCAT44(0x200001,-this->_height);
  local_28 = (ulong)(uint)(iVar1 * 4) << 0x20;
  uStack_40 = 0x3600000000;
  _local_48 = CONCAT44(iVar1 * 4 + 0x36,0x4d420000);
  __s = fopen(fileName,"wb");
  if (__s != (FILE *)0x0) {
    fwrite((void *)((long)&local_48 + 2),0x36,1,__s);
    fwrite(this->_data,(long)this->_height * this->_stride,1,__s);
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

bool writeBmp(const char* fileName) const noexcept {
    BmpHeader bmp;
    bmp.init(_width, _height);

    std::FILE* f = std::fopen(fileName, "wb");
    if (!f)
      return false;

    std::fwrite(&bmp.signature, sizeof(BmpHeader) - 2, 1, f);
    std::fwrite(_data, _stride * _height, 1, f);
    std::fclose(f);
    return true;
  }